

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fixed-dtoa.cc
# Opt level: O2

void TestFastFixedDtoaGayFixed(void)

{
  uint uVar1;
  uint uVar2;
  char *expected_source;
  bool bVar3;
  PrecomputedFixed *pPVar4;
  undefined1 condition;
  int *piVar5;
  int *value_source;
  int in_R9D;
  undefined4 in_register_0000008c;
  ulong uVar6;
  Vector<const_double_conversion::PrecomputedFixed> VVar7;
  Vector<char> buffer;
  int point;
  int length;
  char buffer_container [500];
  int local_238;
  int local_234;
  ulong local_230;
  char local_228 [504];
  
  VVar7 = double_conversion::PrecomputedFixedRepresentations();
  pPVar4 = VVar7.start_;
  uVar6 = 0;
  local_230 = VVar7._8_8_ & 0xffffffff;
  if (VVar7.length_ < 1) {
    local_230 = uVar6;
  }
  local_230 = local_230 << 5;
  for (; local_230 != uVar6; uVar6 = uVar6 + 0x20) {
    uVar1 = *(uint *)((long)&pPVar4->number_digits + uVar6);
    expected_source = *(char **)((long)&pPVar4->representation + uVar6);
    uVar2 = *(uint *)((long)&pPVar4->decimal_point + uVar6);
    piVar5 = &local_234;
    buffer._8_8_ = piVar5;
    buffer.start_ = (char *)0x1f4;
    value_source = &local_238;
    bVar3 = double_conversion::FastFixedDtoa
                      ((double_conversion *)(ulong)uVar1,*(double *)((long)&pPVar4->v + uVar6),
                       (int)local_228,buffer,&local_238,(int *)CONCAT44(in_register_0000008c,in_R9D)
                      );
    CheckHelper((char *)0x1fe,0xc19e99,(char *)(ulong)bVar3,SUB81(piVar5,0));
    condition = (undefined1)local_238;
    CheckEqualsHelper((char *)0x1ff,0xc0d28f,(char *)(ulong)uVar2,local_238,(char *)value_source,
                      in_R9D);
    CheckHelper((char *)0x200,0xc1becd,(char *)(ulong)(local_234 - local_238 <= (int)uVar1),
                (bool)condition);
    CheckEqualsHelper((char *)0x201,0xc0d2aa,expected_source,local_228,(char *)value_source,
                      (char *)CONCAT44(in_register_0000008c,in_R9D));
  }
  return;
}

Assistant:

TEST(FastFixedDtoaGayFixed) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool status;
  int length;
  int point;

  Vector<const PrecomputedFixed> precomputed =
      PrecomputedFixedRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedFixed current_test = precomputed[i];
    double v = current_test.v;
    int number_digits = current_test.number_digits;
    status = FastFixedDtoa(v, number_digits,
                           buffer, &length, &point);
    CHECK(status);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK(number_digits >= length - point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}